

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O1

void __thiscall SessionObjectStore::tokenLoggedOut(SessionObjectStore *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *__x;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<SessionObject_*>,_std::_Rb_tree_iterator<SessionObject_*>_> pVar3;
  MutexLocker lock;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> checkObjects;
  MutexLocker local_60;
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  local_50;
  
  MutexLocker::MutexLocker(&local_60,this->storeMutex);
  __x = &this->objects;
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::_Rb_tree(&local_50,&__x->_M_t);
  for (p_Var2 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_50._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    bVar1 = SessionObject::removeOnTokenLogout(*(SessionObject **)(p_Var2 + 1),slotID);
    if (bVar1) {
      pVar3 = std::
              _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
              ::equal_range(&__x->_M_t,(key_type *)(p_Var2 + 1));
      std::
      _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
      ::_M_erase_aux(&__x->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
    }
  }
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::~_Rb_tree(&local_50);
  MutexLocker::~MutexLocker(&local_60);
  return;
}

Assistant:

void SessionObjectStore::tokenLoggedOut(CK_SLOT_ID slotID)
{
	MutexLocker lock(storeMutex);

	std::set<SessionObject*> checkObjects = objects;

	for (std::set<SessionObject*>::iterator i = checkObjects.begin(); i != checkObjects.end(); i++)
	{
		if ((*i)->removeOnTokenLogout(slotID))
		{
			// Since the object remains in the allObjects set, any pointers to it will
			// remain valid but it will no longer be returned when the set of objects
			// is requested
			objects.erase(*i);
		}
	}
}